

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O2

void __thiscall cppjit::builder::builder::builder(builder *this,string *kernel_name,bool verbose)

{
  allocator local_29;
  
  this->_vptr_builder = (_func_int **)&PTR___cxa_pure_virtual_00108d80;
  std::__cxx11::string::string((string *)&this->kernel_name,(string *)kernel_name);
  this->verbose = verbose;
  this->do_cleanup = true;
  this->has_source_ = false;
  this->has_inline_source_ = false;
  (this->source)._M_dataplus._M_p = (pointer)&(this->source).field_2;
  (this->source)._M_string_length = 0;
  (this->source).field_2._M_local_buf[0] = '\0';
  (this->source_dir)._M_dataplus._M_p = (pointer)&(this->source_dir).field_2;
  (this->source_dir)._M_string_length = 0;
  (this->source_dir).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->compile_dir,"",&local_29);
  this->compile_dir_created = false;
  this->kernel_library = (void *)0x0;
  return;
}

Assistant:

builder(const std::string &kernel_name, bool verbose = false)
      : kernel_name(kernel_name),
        verbose(verbose),
        do_cleanup(true),
        has_source_(false),
        has_inline_source_(false),
        // source_dir(DEFAULT_KERNEL_COMPILE_DIR),
        compile_dir(""),
        compile_dir_created(false),
        kernel_library(nullptr) {}